

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O2

void amrex::parser_ast_setconst(parser_node *node,char *name,double c)

{
  int iVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  do {
    lVar2 = 8;
    switch(node->type) {
    case PARSER_NUMBER:
      return;
    case PARSER_SYMBOL:
      iVar1 = strcmp(name,(char *)node->l);
      if (iVar1 != 0) {
        return;
      }
      node->type = PARSER_NUMBER;
      node->l = (parser_node *)c;
      return;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_F2:
    case PARSER_LIST:
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
      parser_ast_setconst(node->l,name,c);
    case PARSER_ASSIGN:
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
      lVar2 = 0x10;
      break;
    case PARSER_NEG:
    case PARSER_F1:
    case PARSER_NEG_P:
      break;
    case PARSER_F3:
      parser_ast_setconst(node->l,name,c);
      parser_ast_setconst(node->r,name,c);
      lVar2 = 0x18;
      break;
    default:
      std::__cxx11::to_string(&local_50,node->type);
      std::operator+(&local_70,"parser_ast_setconst: unknown node type ",&local_50);
      Abort(&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      return;
    }
    node = *(parser_node **)((long)&node->type + lVar2);
  } while( true );
}

Assistant:

void parser_ast_setconst (struct parser_node* node, char const* name, double c)
{
    switch (node->type)
    {
    case PARSER_NUMBER:
        break;
    case PARSER_SYMBOL:
        if (std::strcmp(name, ((struct parser_symbol*)node)->name) == 0) {
            ((struct parser_number*)node)->type = PARSER_NUMBER;
            ((struct parser_number*)node)->value = c;
        }
        break;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
    case PARSER_LIST:
        parser_ast_setconst(node->l, name, c);
        parser_ast_setconst(node->r, name, c);
        break;
    case PARSER_NEG:
    case PARSER_NEG_P:
        parser_ast_setconst(node->l, name, c);
        break;
    case PARSER_F1:
        parser_ast_setconst(((struct parser_f1*)node)->l, name, c);
        break;
    case PARSER_F2:
        parser_ast_setconst(((struct parser_f2*)node)->l, name, c);
        parser_ast_setconst(((struct parser_f2*)node)->r, name, c);
        break;
    case PARSER_F3:
        parser_ast_setconst(((struct parser_f3*)node)->n1, name, c);
        parser_ast_setconst(((struct parser_f3*)node)->n2, name, c);
        parser_ast_setconst(((struct parser_f3*)node)->n3, name, c);
        break;
    case PARSER_ASSIGN:
        parser_ast_setconst(((struct parser_assign*)node)->v, name, c);
        break;
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
        parser_ast_setconst(node->r, name, c);
        break;
    default:
        amrex::Abort("parser_ast_setconst: unknown node type " + std::to_string(node->type));
    }
}